

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelCreationUtils.cpp
# Opt level: O3

void createSimpleFeatureVectorizerModel
               (Model *spec,char *outputName,ArrayFeatureType_ArrayDataType arrayType,int inputSize)

{
  RepeatedField<long> *this;
  int iVar1;
  Rep *pRVar2;
  RepeatedPtrFieldBase *pRVar3;
  char *pcVar4;
  Model *pMVar5;
  uint uVar6;
  uint uVar7;
  ModelDescription *pMVar8;
  Metadata *pMVar9;
  FeatureType *pFVar10;
  DoubleFeatureType *pDVar11;
  long *plVar12;
  FeatureDescription *pFVar13;
  ArrayFeatureType *pAVar14;
  TreeEnsembleClassifier *pTVar15;
  FeatureVectorizer_InputColumn *obj;
  void *pvVar16;
  ulong uVar17;
  long *plVar18;
  undefined8 *puVar19;
  Arena *pAVar20;
  uint uVar21;
  Arena *pAVar22;
  long tmp;
  uint uVar23;
  string __str;
  long *local_90;
  long local_88;
  long local_80;
  undefined4 uStack_78;
  undefined4 uStack_74;
  long *local_70 [2];
  long local_60 [2];
  RepeatedPtrFieldBase *local_50;
  ArrayFeatureType_ArrayDataType local_44;
  char *local_40;
  Model *local_38;
  
  spec->specificationversion_ = 9;
  pMVar8 = spec->description_;
  local_44 = arrayType;
  if (pMVar8 == (ModelDescription *)0x0) {
    uVar17 = (spec->super_MessageLite)._internal_metadata_.ptr_;
    pAVar22 = (Arena *)(uVar17 & 0xfffffffffffffffc);
    if ((uVar17 & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    pMVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                       (pAVar22);
    spec->description_ = pMVar8;
  }
  pMVar9 = pMVar8->metadata_;
  if (pMVar9 == (Metadata *)0x0) {
    uVar17 = (pMVar8->super_MessageLite)._internal_metadata_.ptr_;
    pAVar22 = (Arena *)(uVar17 & 0xfffffffffffffffc);
    if ((uVar17 & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    pMVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Metadata>(pAVar22);
    pMVar8->metadata_ = pMVar9;
  }
  local_90 = &local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Testing serialization","");
  uVar17 = (pMVar9->super_MessageLite)._internal_metadata_.ptr_;
  puVar19 = (undefined8 *)(uVar17 & 0xfffffffffffffffc);
  if ((uVar17 & 1) != 0) {
    puVar19 = (undefined8 *)*puVar19;
  }
  google::protobuf::internal::ArenaStringPtr::Set(&pMVar9->shortdescription_,&local_90,puVar19);
  local_40 = outputName;
  local_38 = spec;
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if (0 < inputSize) {
    local_50 = &(pMVar8->input_).super_RepeatedPtrFieldBase;
    uVar23 = 0;
    do {
      pRVar3 = local_50;
      pRVar2 = (pMVar8->input_).super_RepeatedPtrFieldBase.rep_;
      if (pRVar2 == (Rep *)0x0) {
LAB_001e0ffd:
        pFVar13 = google::protobuf::Arena::
                  CreateMaybeMessage<CoreML::Specification::FeatureDescription>(local_50->arena_);
        pvVar16 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                            (pRVar3,pFVar13);
      }
      else {
        iVar1 = (pMVar8->input_).super_RepeatedPtrFieldBase.current_size_;
        if (pRVar2->allocated_size <= iVar1) goto LAB_001e0ffd;
        (pMVar8->input_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
        pvVar16 = pRVar2->elements[iVar1];
      }
      pFVar10 = (FeatureType *)operator_new(0x28);
      CoreML::Specification::FeatureType::FeatureType(pFVar10,(Arena *)0x0,false);
      if (pFVar10->_oneof_case_[0] != 2) {
        CoreML::Specification::FeatureType::clear_Type(pFVar10);
        pFVar10->_oneof_case_[0] = 2;
        uVar17 = (pFVar10->super_MessageLite)._internal_metadata_.ptr_;
        pAVar22 = (Arena *)(uVar17 & 0xfffffffffffffffc);
        if ((uVar17 & 1) != 0) {
          pAVar22 = *(Arena **)pAVar22;
        }
        pDVar11 = google::protobuf::Arena::
                  CreateMaybeMessage<CoreML::Specification::DoubleFeatureType>(pAVar22);
        (pFVar10->Type_).doubletype_ = pDVar11;
      }
      uVar21 = 1;
      if (9 < uVar23) {
        uVar17 = (ulong)uVar23;
        uVar6 = 4;
        do {
          uVar21 = uVar6;
          uVar7 = (uint)uVar17;
          if (uVar7 < 100) {
            uVar21 = uVar21 - 2;
            goto LAB_001e10b2;
          }
          if (uVar7 < 1000) {
            uVar21 = uVar21 - 1;
            goto LAB_001e10b2;
          }
          if (uVar7 < 10000) goto LAB_001e10b2;
          uVar17 = uVar17 / 10000;
          uVar6 = uVar21 + 4;
        } while (99999 < uVar7);
        uVar21 = uVar21 + 1;
      }
LAB_001e10b2:
      local_70[0] = local_60;
      std::__cxx11::string::_M_construct((ulong)local_70,(char)uVar21);
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_70[0],uVar21,uVar23);
      plVar12 = (long *)std::__cxx11::string::replace((ulong)local_70,0,(char *)0x0,0x3a8ef3);
      plVar18 = plVar12 + 2;
      if ((long *)*plVar12 == plVar18) {
        local_80 = *plVar18;
        uStack_78 = (undefined4)plVar12[3];
        uStack_74 = *(undefined4 *)((long)plVar12 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar18;
        local_90 = (long *)*plVar12;
      }
      local_88 = plVar12[1];
      *plVar12 = (long)plVar18;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      puVar19 = (undefined8 *)(*(ulong *)((long)pvVar16 + 8) & 0xfffffffffffffffc);
      if ((*(ulong *)((long)pvVar16 + 8) & 1) != 0) {
        puVar19 = (undefined8 *)*puVar19;
      }
      google::protobuf::internal::ArenaStringPtr::Set
                ((ArenaStringPtr *)((long)pvVar16 + 0x10),&local_90,puVar19);
      if (local_90 != &local_80) {
        operator_delete(local_90,local_80 + 1);
      }
      if (local_70[0] != local_60) {
        operator_delete(local_70[0],local_60[0] + 1);
      }
      pAVar22 = (Arena *)(*(ulong *)((long)pvVar16 + 8) & 0xfffffffffffffffc);
      if ((*(ulong *)((long)pvVar16 + 8) & 1) != 0) {
        pAVar22 = *(Arena **)pAVar22;
      }
      if ((pAVar22 == (Arena *)0x0) && (*(long **)((long)pvVar16 + 0x20) != (long *)0x0)) {
        (**(code **)(**(long **)((long)pvVar16 + 0x20) + 8))();
      }
      uVar17 = (pFVar10->super_MessageLite)._internal_metadata_.ptr_;
      if ((uVar17 & 2) == 0) {
        pAVar20 = (Arena *)(uVar17 & 0xfffffffffffffffc);
        if ((uVar17 & 1) != 0) {
          pAVar20 = *(Arena **)pAVar20;
        }
      }
      else {
        pAVar20 = (Arena *)0x0;
      }
      if (pAVar22 != pAVar20) {
        pFVar10 = (FeatureType *)
                  google::protobuf::internal::GetOwnedMessageInternal
                            (pAVar22,(MessageLite *)pFVar10,pAVar20);
      }
      *(FeatureType **)((long)pvVar16 + 0x20) = pFVar10;
      uVar23 = uVar23 + 1;
    } while (uVar23 != inputSize);
  }
  pRVar2 = (pMVar8->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar2 != (Rep *)0x0) {
    iVar1 = (pMVar8->output_).super_RepeatedPtrFieldBase.current_size_;
    if (iVar1 < pRVar2->allocated_size) {
      (pMVar8->output_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
      pvVar16 = pRVar2->elements[iVar1];
      goto LAB_001e124d;
    }
  }
  pFVar13 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                      ((pMVar8->output_).super_RepeatedPtrFieldBase.arena_);
  pvVar16 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                      (&(pMVar8->output_).super_RepeatedPtrFieldBase,pFVar13);
LAB_001e124d:
  pFVar10 = (FeatureType *)operator_new(0x28);
  CoreML::Specification::FeatureType::FeatureType(pFVar10,(Arena *)0x0,false);
  if (pFVar10->_oneof_case_[0] == 5) {
    pAVar14 = (pFVar10->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar10);
    pFVar10->_oneof_case_[0] = 5;
    uVar17 = (pFVar10->super_MessageLite)._internal_metadata_.ptr_;
    pAVar22 = (Arena *)(uVar17 & 0xfffffffffffffffc);
    if ((uVar17 & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    pAVar14 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                        (pAVar22);
    (pFVar10->Type_).multiarraytype_ = pAVar14;
  }
  this = &pAVar14->shape_;
  uVar23 = (pAVar14->shape_).current_size_;
  if (uVar23 == (pAVar14->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar23 + 1);
    plVar12 = google::protobuf::RepeatedField<long>::elements(this);
    plVar12[uVar23] = (long)inputSize;
  }
  else {
    plVar12 = google::protobuf::RepeatedField<long>::elements(this);
    plVar12[uVar23] = (long)inputSize;
  }
  pcVar4 = local_40;
  this->current_size_ = uVar23 + 1;
  if (pFVar10->_oneof_case_[0] == 5) {
    pAVar14 = (pFVar10->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar10);
    pFVar10->_oneof_case_[0] = 5;
    uVar17 = (pFVar10->super_MessageLite)._internal_metadata_.ptr_;
    pAVar22 = (Arena *)(uVar17 & 0xfffffffffffffffc);
    if ((uVar17 & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    pAVar14 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                        (pAVar22);
    (pFVar10->Type_).multiarraytype_ = pAVar14;
  }
  pAVar14->datatype_ = local_44;
  puVar19 = (undefined8 *)(*(ulong *)((long)pvVar16 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar16 + 8) & 1) != 0) {
    puVar19 = (undefined8 *)*puVar19;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar16 + 0x10),pcVar4,puVar19);
  pAVar22 = (Arena *)(*(ulong *)((long)pvVar16 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar16 + 8) & 1) != 0) {
    pAVar22 = *(Arena **)pAVar22;
  }
  if ((pAVar22 == (Arena *)0x0) && (*(long **)((long)pvVar16 + 0x20) != (long *)0x0)) {
    (**(code **)(**(long **)((long)pvVar16 + 0x20) + 8))();
  }
  uVar17 = (pFVar10->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar17 & 2) == 0) {
    pAVar20 = (Arena *)(uVar17 & 0xfffffffffffffffc);
    if ((uVar17 & 1) != 0) {
      pAVar20 = *(Arena **)pAVar20;
    }
  }
  else {
    pAVar20 = (Arena *)0x0;
  }
  if (pAVar22 != pAVar20) {
    pFVar10 = (FeatureType *)
              google::protobuf::internal::GetOwnedMessageInternal
                        (pAVar22,(MessageLite *)pFVar10,pAVar20);
  }
  pMVar5 = local_38;
  *(FeatureType **)((long)pvVar16 + 0x20) = pFVar10;
  if (local_38->_oneof_case_[0] == 0x25a) {
    pTVar15 = (local_38->Type_).treeensembleclassifier_;
  }
  else {
    CoreML::Specification::Model::clear_Type(local_38);
    pMVar5->_oneof_case_[0] = 0x25a;
    uVar17 = (pMVar5->super_MessageLite)._internal_metadata_.ptr_;
    pAVar22 = (Arena *)(uVar17 & 0xfffffffffffffffc);
    if ((uVar17 & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    pTVar15 = (TreeEnsembleClassifier *)
              google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureVectorizer>
                        (pAVar22);
    (pMVar5->Type_).featurevectorizer_ = (FeatureVectorizer *)pTVar15;
  }
  if (0 < inputSize) {
    local_50 = (RepeatedPtrFieldBase *)&pTVar15->treeensemble_;
    uVar23 = 0;
    do {
      pRVar3 = local_50;
      pRVar2 = (Rep *)(pTVar15->ClassLabels_).stringclasslabels_;
      if (pRVar2 == (Rep *)0x0) {
LAB_001e141e:
        obj = google::protobuf::Arena::
              CreateMaybeMessage<CoreML::Specification::FeatureVectorizer_InputColumn>
                        (local_50->arena_);
        pvVar16 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper(pRVar3,obj);
      }
      else {
        iVar1 = pTVar15->postevaluationtransform_;
        if (pRVar2->allocated_size <= iVar1) goto LAB_001e141e;
        pTVar15->postevaluationtransform_ = iVar1 + 1;
        pvVar16 = pRVar2->elements[iVar1];
      }
      uVar21 = 1;
      if (9 < uVar23) {
        uVar17 = (ulong)uVar23;
        uVar6 = 4;
        do {
          uVar21 = uVar6;
          uVar7 = (uint)uVar17;
          if (uVar7 < 100) {
            uVar21 = uVar21 - 2;
            goto LAB_001e1481;
          }
          if (uVar7 < 1000) {
            uVar21 = uVar21 - 1;
            goto LAB_001e1481;
          }
          if (uVar7 < 10000) goto LAB_001e1481;
          uVar17 = uVar17 / 10000;
          uVar6 = uVar21 + 4;
        } while (99999 < uVar7);
        uVar21 = uVar21 + 1;
      }
LAB_001e1481:
      local_70[0] = local_60;
      std::__cxx11::string::_M_construct((ulong)local_70,(char)uVar21);
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_70[0],uVar21,uVar23);
      plVar12 = (long *)std::__cxx11::string::replace((ulong)local_70,0,(char *)0x0,0x3a8ef3);
      plVar18 = plVar12 + 2;
      if ((long *)*plVar12 == plVar18) {
        local_80 = *plVar18;
        uStack_78 = (undefined4)plVar12[3];
        uStack_74 = *(undefined4 *)((long)plVar12 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar18;
        local_90 = (long *)*plVar12;
      }
      local_88 = plVar12[1];
      *plVar12 = (long)plVar18;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      puVar19 = (undefined8 *)(*(ulong *)((long)pvVar16 + 8) & 0xfffffffffffffffc);
      if ((*(ulong *)((long)pvVar16 + 8) & 1) != 0) {
        puVar19 = (undefined8 *)*puVar19;
      }
      google::protobuf::internal::ArenaStringPtr::Set
                ((ArenaStringPtr *)((long)pvVar16 + 0x10),&local_90,puVar19);
      if (local_90 != &local_80) {
        operator_delete(local_90,local_80 + 1);
      }
      if (local_70[0] != local_60) {
        operator_delete(local_70[0],local_60[0] + 1);
      }
      *(undefined8 *)((long)pvVar16 + 0x18) = 1;
      uVar23 = uVar23 + 1;
    } while (uVar23 != inputSize);
  }
  return;
}

Assistant:

void createSimpleFeatureVectorizerModel(Specification::Model *spec, const char *outputName, Specification::ArrayFeatureType_ArrayDataType arrayType, int inputSize) {
    
    spec->set_specificationversion(MLMODEL_SPECIFICATION_VERSION);
    
    auto interface = spec->mutable_description();
    auto metadata = interface->mutable_metadata();
    metadata->set_shortdescription(std::string("Testing serialization"));
    
    for (int d = 0; d < inputSize; d++) {
        auto input = interface->add_input();
        auto inputType = new Specification::FeatureType;
        inputType->mutable_doubletype();
        input->set_name("input" + std::to_string(d));
        input->set_allocated_type(inputType);
    }
    
    auto output = interface->add_output();
    auto outputType = new Specification::FeatureType;
    outputType->mutable_multiarraytype()->mutable_shape()->Add(inputSize);
    outputType->mutable_multiarraytype()->set_datatype(arrayType);
    output->set_name(outputName);
    output->set_allocated_type(outputType);
    
    auto featurVectorizerModel = spec->mutable_featurevectorizer();
    
    for (int d = 0; d < inputSize; d++) {
        auto inputlist = featurVectorizerModel->add_inputlist();
        inputlist->set_inputcolumn("input" + std::to_string(d));
        inputlist->set_inputdimensions(1);
    }
    
}